

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeShape.cpp
# Opt level: O0

btVector3 __thiscall btConeShape::localGetSupportingVertex(btConeShape *this,btVector3 *vec)

{
  long *in_RDI;
  float fVar1;
  btScalar bVar2;
  btVector3 vecnorm;
  btVector3 supVertex;
  btVector3 *in_stack_ffffffffffffff98;
  btVector3 *this_00;
  btVector3 local_4c;
  btScalar local_3c;
  btScalar in_stack_ffffffffffffffc8;
  btScalar in_stack_ffffffffffffffcc;
  btConeShape *in_stack_ffffffffffffffd0;
  btVector3 local_10;
  
  local_10 = coneLocalSupport(in_stack_ffffffffffffffd0,
                              (btVector3 *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  fVar1 = (float)(**(code **)(*in_RDI + 0x60))();
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    bVar2 = btVector3::length2((btVector3 *)0x1af338);
    if (bVar2 < 1.4210855e-14) {
      local_3c = -1.0;
      btVector3::setValue((btVector3 *)&stack0xffffffffffffffd0,(btScalar *)&stack0xffffffffffffffcc
                          ,(btScalar *)&stack0xffffffffffffffc8,&local_3c);
    }
    this_00 = (btVector3 *)&stack0xffffffffffffffd0;
    btVector3::normalize(this_00);
    (**(code **)(*in_RDI + 0x60))();
    local_4c = ::operator*(this_00->m_floats,in_stack_ffffffffffffff98);
    btVector3::operator+=(&local_10,&local_4c);
  }
  return (btVector3)local_10.m_floats;
}

Assistant:

btVector3	btConeShape::localGetSupportingVertex(const btVector3& vec)  const
{
	btVector3 supVertex = coneLocalSupport(vec);
	if ( getMargin()!=btScalar(0.) )
	{
		btVector3 vecnorm = vec;
		if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
		{
			vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
		} 
		vecnorm.normalize();
		supVertex+= getMargin() * vecnorm;
	}
	return supVertex;
}